

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiStackLevelInfo *__dest;
  long lVar5;
  ImGuiStackLevelInfo *pIVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ImGuiContext *ctx;
  int iVar12;
  int iVar13;
  
  pIVar4 = GImGui;
  uVar10 = (ulong)id;
  pIVar3 = GImGui->CurrentWindow;
  iVar2 = (GImGui->DebugStackTool).StackLevel;
  lVar9 = (long)iVar2;
  if (lVar9 == -1) {
    (GImGui->DebugStackTool).StackLevel = 0;
    iVar2 = (pIVar3->IDStack).Size;
    iVar12 = (pIVar4->DebugStackTool).Results.Capacity;
    iVar13 = (int)((long)iVar2 + 1);
    if (iVar12 <= iVar2) {
      if (iVar12 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar12 / 2 + iVar12;
      }
      if (iVar12 <= iVar13) {
        iVar12 = iVar13;
      }
      piVar1 = &(pIVar4->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiStackLevelInfo *)
               (*GImAllocatorAllocFunc)((long)iVar12 << 6,GImAllocatorUserData);
      pIVar6 = (pIVar4->DebugStackTool).Results.Data;
      if (pIVar6 != (ImGuiStackLevelInfo *)0x0) {
        memcpy(__dest,pIVar6,(long)(pIVar4->DebugStackTool).Results.Size << 6);
        pIVar6 = (pIVar4->DebugStackTool).Results.Data;
        if ((pIVar6 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      }
      (pIVar4->DebugStackTool).Results.Data = __dest;
      (pIVar4->DebugStackTool).Results.Capacity = iVar12;
    }
    iVar12 = (pIVar4->DebugStackTool).Results.Size;
    if (iVar12 <= iVar2) {
      lVar5 = ((long)iVar2 + 1) - (long)iVar12;
      lVar9 = (long)iVar12 << 6;
      do {
        pIVar6 = (pIVar4->DebugStackTool).Results.Data;
        pcVar8 = pIVar6->Desc + lVar9 + 0x29;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        pcVar8[8] = '\0';
        pcVar8[9] = '\0';
        pcVar8[10] = '\0';
        pcVar8[0xb] = '\0';
        pcVar8[0xc] = '\0';
        pcVar8[0xd] = '\0';
        pcVar8[0xe] = '\0';
        pcVar8[0xf] = '\0';
        pcVar8 = pIVar6->Desc + lVar9 + 0x19;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        pcVar8[8] = '\0';
        pcVar8[9] = '\0';
        pcVar8[10] = '\0';
        pcVar8[0xb] = '\0';
        pcVar8[0xc] = '\0';
        pcVar8[0xd] = '\0';
        pcVar8[0xe] = '\0';
        pcVar8[0xf] = '\0';
        pcVar8 = pIVar6->Desc + lVar9 + 9;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        pcVar8[8] = '\0';
        pcVar8[9] = '\0';
        pcVar8[10] = '\0';
        pcVar8[0xb] = '\0';
        pcVar8[0xc] = '\0';
        pcVar8[0xd] = '\0';
        pcVar8[0xe] = '\0';
        pcVar8[0xf] = '\0';
        pcVar8 = pIVar6->Desc + lVar9 + -7;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        pcVar8[8] = '\0';
        pcVar8[9] = '\0';
        pcVar8[10] = '\0';
        pcVar8[0xb] = '\0';
        pcVar8[0xc] = '\0';
        pcVar8[0xd] = '\0';
        pcVar8[0xe] = '\0';
        pcVar8[0xf] = '\0';
        lVar9 = lVar9 + 0x40;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    (pIVar4->DebugStackTool).Results.Size = iVar13;
    iVar2 = (pIVar3->IDStack).Size;
    if ((long)iVar2 < 0) {
      return;
    }
    pIVar6 = (pIVar4->DebugStackTool).Results.Data;
    uVar10 = 0;
    do {
      uVar11 = id;
      if (uVar10 < (ulong)(long)iVar2) {
        uVar11 = (pIVar3->IDStack).Data[uVar10];
      }
      pIVar6->ID = uVar11;
      uVar10 = uVar10 + 1;
      pIVar6 = pIVar6 + 1;
    } while (iVar2 + 1 != uVar10);
    return;
  }
  if (iVar2 != (pIVar3->IDStack).Size) {
    return;
  }
  pIVar6 = (GImGui->DebugStackTool).Results.Data;
  switch(data_type) {
  case 4:
    pcVar8 = "%d";
    uVar10 = (ulong)data_id & 0xffffffff;
    goto LAB_0010db9d;
  case 0xb:
    if (data_id_end == (void *)0x0) {
      sVar7 = strlen((char *)data_id);
    }
    else {
      sVar7 = (long)data_id_end - (long)data_id;
    }
    ImFormatString(pIVar6[lVar9].Desc,0x39,"%.*s",sVar7,data_id);
    break;
  case 0xc:
    ImFormatString(pIVar6[lVar9].Desc,0x39,"(void*)0x%p",data_id);
    break;
  case 0xd:
    if (pIVar6[lVar9].Desc[0] != '\0') {
      return;
    }
    pcVar8 = "0x%08X [override]";
LAB_0010db9d:
    ImFormatString(pIVar6[lVar9].Desc,0x39,pcVar8,uVar10);
  }
  pIVar6[lVar9].QuerySuccess = true;
  pIVar6[lVar9].field_0x6 = (char)data_type;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Step 0: stack query
    // This assume that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}